

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_node_tec(REF_GEOM ref_geom,char *filename)

{
  uint uVar1;
  FILE *__s;
  REF_STATUS RVar2;
  uint id;
  REF_DBL xyz [3];
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x11c7,
           "ref_geom_node_tec","unable to open file");
    RVar2 = 2;
  }
  else {
    fwrite("title=\"refine node\"\n",0x14,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"id\"\n",0x1d,1,__s);
    fprintf(__s,"zone t=\"node\", i=%d, datapacking=%s\n",(ulong)(uint)ref_geom->nnode);
    for (id = 1; (int)(id - 1) < ref_geom->nnode; id = id + 1) {
      uVar1 = ref_egads_eval_at(ref_geom,0,id,(REF_DBL *)0x0,xyz,(REF_DBL *)0x0);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x11cf,"ref_geom_node_tec",(ulong)uVar1,"eval edge");
        return uVar1;
      }
      fprintf(__s,"%f %f %f %d\n",xyz[0],xyz[1],xyz[2],(ulong)id);
    }
    fclose(__s);
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_node_tec(REF_GEOM ref_geom, const char *filename) {
  REF_INT i;
  REF_DBL xyz[3];
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine node\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"id\"\n");
  fprintf(file, "zone t=\"node\", i=%d, datapacking=%s\n", ref_geom->nnode,
          "point");
  for (i = 0; i < ref_geom->nnode; i++) {
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_NODE, i + 1, NULL, xyz, NULL),
        "eval edge");
    fprintf(file, "%f %f %f %d\n", xyz[0], xyz[1], xyz[2], i + 1);
  }
  fclose(file);
  return REF_SUCCESS;
}